

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjust-times.cpp
# Opt level: O2

int file_time_adjust_epsilon(char *filename,int direction)

{
  int iVar1;
  int *piVar2;
  int i;
  uint uVar3;
  timespec new_timestamp;
  timespec previous_timestamp;
  
  iVar1 = get_file_mtime(filename,&previous_timestamp);
  if (iVar1 == -1) {
LAB_0010dc6f:
    iVar1 = -1;
  }
  else {
    uVar3 = 5;
    do {
      if ((int)uVar3 < 0) {
        fprintf(_stderr,"%s: Can\'t adjust time to %+.9g\n",0x4000000000000000,filename);
        piVar2 = __errno_location();
        *piVar2 = 0x22;
        goto LAB_0010dc6f;
      }
      iVar1 = file_time_adjust_relative
                        (filename,file_time_adjust_epsilon::epsilons[uVar3] *
                                  (double)(int)(direction >> 0x1f | 1));
      if (iVar1 != 0) goto LAB_0010dc6f;
      iVar1 = get_file_mtime(filename,&new_timestamp);
      if (iVar1 == -1) goto LAB_0010dc6f;
    } while ((new_timestamp.tv_sec == previous_timestamp.tv_sec) &&
            (uVar3 = uVar3 - 1, new_timestamp.tv_nsec == previous_timestamp.tv_nsec));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int file_time_adjust_epsilon(const char* filename, int direction) {
  struct timespec previous_timestamp;
  if (get_file_mtime(filename, &previous_timestamp) == -1) {
    return -1;
  }

  // Attempt differently sized ULPs for different filesystems.
  // What do we know about the file systems' modify time resolutions:
  //  FAT: 2 seconds
  //  HFS, ext3: 1 second
  //  ext4: 1 millisecond
  //  NTFS: 100 nanoseconds
  //  APFS: nanosecond
  static double epsilons[] = {2, 1, 0.001, 0.000001, 0.0000001, 0.000000001};

  // Try to adjust several times with increasingly growing epsilon
  // and see if adjustments results in a material change.
  for (int i = sizeof(epsilons) / sizeof(epsilons[0]) - 1; i >= 0; i--) {
    double e = epsilons[i] * ((direction < 0) ? -1 : 1);
    if (file_time_adjust_relative(filename, e)) {
      return -1;
    }
    struct timespec new_timestamp;
    if (get_file_mtime(filename, &new_timestamp) == -1) {
      return -1;
    }
    if (new_timestamp.tv_sec != previous_timestamp.tv_sec
     || new_timestamp.tv_nsec != previous_timestamp.tv_nsec) {
      return 0;
    }
  }

  fprintf(stderr, "%s: Can't adjust time to %+.9g\n", filename, epsilons[0]);
  errno = ERANGE;
  return -1;
}